

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_pk8.cc
# Opt level: O0

EVP_PKEY * d2i_PKCS8PrivateKey_bio(BIO *bp,EVP_PKEY **x,undefined1 *cb,void *u)

{
  int passlen;
  X509_SIG *p8_00;
  PKCS8_PRIV_KEY_INFO *p8_01;
  char local_458 [8];
  char psbuf [1024];
  EVP_PKEY *ret;
  int pass_len;
  X509_SIG *p8;
  PKCS8_PRIV_KEY_INFO *p8inf;
  void *u_local;
  pem_password_cb *cb_local;
  EVP_PKEY **x_local;
  BIO *bp_local;
  
  p8_00 = d2i_PKCS8_bio(bp,(X509_SIG **)0x0);
  if (p8_00 == (X509_SIG *)0x0) {
    bp_local = (BIO *)0x0;
  }
  else {
    u_local = cb;
    if (cb == (undefined1 *)0x0) {
      u_local = PEM_def_callback;
    }
    passlen = (*(code *)u_local)(local_458,0x400,0,u);
    if (passlen < 0) {
      ERR_put_error(9,0,0x68,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pem/pem_pk8.cc"
                    ,0x7f);
      X509_SIG_free(p8_00);
      bp_local = (BIO *)0x0;
    }
    else {
      p8_01 = PKCS8_decrypt(p8_00,local_458,passlen);
      X509_SIG_free(p8_00);
      OPENSSL_cleanse(local_458,(long)passlen);
      if (p8_01 == (PKCS8_PRIV_KEY_INFO *)0x0) {
        bp_local = (BIO *)0x0;
      }
      else {
        bp_local = (BIO *)EVP_PKCS82PKEY(p8_01);
        PKCS8_PRIV_KEY_INFO_free(p8_01);
        if (bp_local == (BIO *)0x0) {
          bp_local = (BIO *)0x0;
        }
        else if (x != (EVP_PKEY **)0x0) {
          if (*x != (EVP_PKEY *)0x0) {
            EVP_PKEY_free(*x);
          }
          *x = (EVP_PKEY *)bp_local;
        }
      }
    }
  }
  return (EVP_PKEY *)bp_local;
}

Assistant:

EVP_PKEY *d2i_PKCS8PrivateKey_bio(BIO *bp, EVP_PKEY **x, pem_password_cb *cb,
                                  void *u) {
  PKCS8_PRIV_KEY_INFO *p8inf = NULL;
  X509_SIG *p8 = NULL;
  int pass_len;
  EVP_PKEY *ret;
  char psbuf[PEM_BUFSIZE];
  p8 = d2i_PKCS8_bio(bp, NULL);
  if (!p8) {
    return NULL;
  }

  pass_len = 0;
  if (!cb) {
    cb = PEM_def_callback;
  }
  pass_len = cb(psbuf, PEM_BUFSIZE, 0, u);
  if (pass_len < 0) {
    OPENSSL_PUT_ERROR(PEM, PEM_R_BAD_PASSWORD_READ);
    X509_SIG_free(p8);
    return NULL;
  }
  p8inf = PKCS8_decrypt(p8, psbuf, pass_len);
  X509_SIG_free(p8);
  OPENSSL_cleanse(psbuf, pass_len);
  if (!p8inf) {
    return NULL;
  }
  ret = EVP_PKCS82PKEY(p8inf);
  PKCS8_PRIV_KEY_INFO_free(p8inf);
  if (!ret) {
    return NULL;
  }
  if (x) {
    if (*x) {
      EVP_PKEY_free(*x);
    }
    *x = ret;
  }
  return ret;
}